

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O3

void __thiscall
QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate(QAbstractFileEnginePrivate *this)

{
  Data *pDVar1;
  
  this->_vptr_QAbstractFileEnginePrivate = (_func_int **)&PTR__QAbstractFileEnginePrivate_001dc848;
  pDVar1 = (this->errorString).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->errorString).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate()
    = default;